

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

OneofOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::OneofOptions>
          (Tables *this,OneofOptions *param_1)

{
  OneofOptions *this_00;
  OneofOptions *local_38 [3];
  OneofOptions *local_20;
  OneofOptions *result;
  OneofOptions *param_1_local;
  Tables *this_local;
  
  result = param_1;
  param_1_local = (OneofOptions *)this;
  this_00 = (OneofOptions *)operator_new(0x68);
  OneofOptions::OneofOptions(this_00);
  local_38[0] = this_00;
  local_20 = this_00;
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::push_back
            (&this->messages_,(value_type *)local_38);
  return local_20;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}